

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O2

PIPELINE_STATE_STATUS __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetStatus
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,bool WaitForCompletion)

{
  ASYNC_TASK_STATUS AVar1;
  char (*in_RCX) [55];
  string msg;
  string local_38;
  
  if ((this->m_Status)._M_i == PIPELINE_STATE_STATUS_UNINITIALIZED) {
    FormatString<char[26],char[55]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Status.load() != PIPELINE_STATE_STATUS_UNINITIALIZED",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2fb);
    std::__cxx11::string::~string((string *)&local_38);
  }
  AVar1 = AsyncInitializer::Update(&this->m_AsyncInitializer,WaitForCompletion);
  if ((AVar1 == ASYNC_TASK_STATUS_COMPLETE) && ((this->m_Status)._M_i < PIPELINE_STATE_STATUS_READY)
     ) {
    FormatString<char[91]>
              (&local_38,
               (char (*) [91])
               "Pipeline state status must be atomically set by the initialization task before it finishes"
              );
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetStatus",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2ff);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return (this->m_Status)._M_i;
}

Assistant:

GetStatus(bool WaitForCompletion = false) override
    {
        VERIFY_EXPR(m_Status.load() != PIPELINE_STATE_STATUS_UNINITIALIZED);
        ASYNC_TASK_STATUS InitTaskStatus = AsyncInitializer::Update(m_AsyncInitializer, WaitForCompletion);
        if (InitTaskStatus == ASYNC_TASK_STATUS_COMPLETE)
        {
            VERIFY(m_Status.load() > PIPELINE_STATE_STATUS_COMPILING, "Pipeline state status must be atomically set by the initialization task before it finishes");
        }
        return m_Status.load();
    }